

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzsparseblockdiagonal.cpp
# Opt level: O0

complex<float> __thiscall
TPZSparseBlockDiagonal<std::complex<float>_>::Get
          (TPZSparseBlockDiagonal<std::complex<float>_> *this,int64_t row,int64_t col)

{
  int iVar1;
  _ComplexT extraout_RAX;
  _ComplexT extraout_RAX_00;
  int *piVar2;
  long *plVar3;
  complex<float> *pcVar4;
  complex<float> cVar5;
  TPZSparseBlockDiagonal<std::complex<float>_> *in_RDX;
  long in_RDI;
  int64_t pos;
  int64_t cblockindex;
  int64_t cblock;
  int64_t rblockindex;
  int64_t rblock;
  long local_40;
  int64_t *in_stack_ffffffffffffffc8;
  int64_t *in_stack_ffffffffffffffd0;
  int64_t *in_stack_ffffffffffffffd8;
  complex<float> local_8;
  
  FindBlockIndex(in_RDX,(int64_t)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                 in_stack_ffffffffffffffc8);
  if (in_stack_ffffffffffffffd8 == (int64_t *)0xffffffffffffffff) {
    std::complex<float>::complex(&local_8,0.0,0.0);
    cVar5._M_value = extraout_RAX;
  }
  else {
    FindBlockIndex(in_RDX,(int64_t)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                   in_stack_ffffffffffffffc8);
    if (in_stack_ffffffffffffffc8 == in_stack_ffffffffffffffd8) {
      piVar2 = TPZVec<int>::operator[]
                         ((TPZVec<int> *)(in_RDI + 0x60),(int64_t)in_stack_ffffffffffffffd8);
      iVar1 = *piVar2;
      plVar3 = TPZVec<long>::operator[]
                         ((TPZVec<long> *)(in_RDI + 0x40),(int64_t)in_stack_ffffffffffffffd8);
      pcVar4 = TPZVec<std::complex<float>_>::operator[]
                         ((TPZVec<std::complex<float>_> *)(in_RDI + 0x20),
                          (long)in_stack_ffffffffffffffd0 + *plVar3 + local_40 * iVar1);
      cVar5._M_value = pcVar4->_M_value;
    }
    else {
      std::complex<float>::complex(&local_8,0.0,0.0);
      cVar5._M_value = extraout_RAX_00;
    }
  }
  return (complex<float>)cVar5._M_value;
}

Assistant:

const TVar TPZSparseBlockDiagonal<TVar>::Get(const int64_t row, const int64_t col) const
{
	int64_t rblock,rblockindex,cblock,cblockindex;
	FindBlockIndex(row,rblock,rblockindex);
	if(rblock == -1) return (TVar)0;
	FindBlockIndex(col,cblock,cblockindex);
	if(cblock != rblock) return (TVar)0;
	int64_t pos = rblockindex + cblockindex*this->fBlockSize[rblock];
	return this->fStorage[this->fBlockPos[rblock]+pos];
}